

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSpecConstantTests.cpp
# Opt level: O0

string * __thiscall
vkt::pipeline::(anonymous_namespace)::generateSpecConstantCode_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
          *specConstants)

{
  bool bVar1;
  pointer pSVar2;
  ulong uVar3;
  ostream *poVar4;
  string local_1f8;
  ulong local_1d8;
  size_type pos;
  string local_1c0 [8];
  string decl;
  __normal_iterator<const_vkt::pipeline::(anonymous_namespace)::SpecConstant_*,_std::vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>_>
  local_198;
  const_iterator it;
  ostringstream code;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *specConstants_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&it);
  local_198._M_current =
       (SpecConstant *)
       std::
       vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
       ::begin((vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
                *)this);
  while( true ) {
    decl.field_2._8_8_ =
         std::
         vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
         ::end((vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
                *)this);
    bVar1 = __gnu_cxx::operator!=
                      (&local_198,
                       (__normal_iterator<const_vkt::pipeline::(anonymous_namespace)::SpecConstant_*,_std::vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>_>
                        *)((long)&decl.field_2 + 8));
    if (!bVar1) break;
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_vkt::pipeline::(anonymous_namespace)::SpecConstant_*,_std::vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>_>
             ::operator->(&local_198);
    std::__cxx11::string::string(local_1c0,(string *)&pSVar2->declarationCode);
    uVar3 = std::__cxx11::string::find((char *)local_1c0,0x13141f3);
    local_1d8 = uVar3;
    if (uVar3 != 0xffffffffffffffff) {
      pSVar2 = __gnu_cxx::
               __normal_iterator<const_vkt::pipeline::(anonymous_namespace)::SpecConstant_*,_std::vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>_>
               ::operator->(&local_198);
      de::toString<unsigned_int>(&local_1f8,&pSVar2->specID);
      std::__cxx11::string::replace((ulong)local_1c0,uVar3,(string *)0x5);
      std::__cxx11::string::~string((string *)&local_1f8);
    }
    poVar4 = std::operator<<((ostream *)&it,local_1c0);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string(local_1c0);
    __gnu_cxx::
    __normal_iterator<const_vkt::pipeline::(anonymous_namespace)::SpecConstant_*,_std::vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>_>
    ::operator++(&local_198);
  }
  std::operator<<((ostream *)&it,"\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&it);
  return __return_storage_ptr__;
}

Assistant:

std::string generateSpecConstantCode (const std::vector<SpecConstant>& specConstants)
{
	std::ostringstream code;
	for (std::vector<SpecConstant>::const_iterator it = specConstants.begin(); it != specConstants.end(); ++it)
	{
		std::string decl = it->declarationCode;
		const std::string::size_type pos = decl.find("${ID}");
		if (pos != std::string::npos)
			decl.replace(pos, 5, de::toString(it->specID));
		code << decl << "\n";
	}
	code << "\n";
	return code.str();
}